

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

void __thiscall
MADPComponentFactoredStates::MADPComponentFactoredStates(MADPComponentFactoredStates *this)

{
  map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  
  this->_vptr_MADPComponentFactoredStates = (_func_int **)&PTR__MADPComponentFactoredStates_0061e158
  ;
  this->_m_initialized = false;
  this->_m_nrStates = 0;
  this->_m_nrStateFactors = 0;
  (this->_m_sfacDomainSizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_sfacDomainSizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_sfacDomainSizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_stepSize = (size_t *)0x0;
  (this->_m_stateFactors).
  super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_stateFactors).
  super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_m_stepSize = (size_t *)0x0;
  (this->_m_stateFactors).
  super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_stateFactors).
  super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_stateFactors).
  super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_allStateFactorScope).super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_m_allStateFactorScope).super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_m_allStateFactorScope).super_SDT.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->_m_initialStateDistribution = (FactoredStateDistribution *)0x0;
  pmVar1 = (map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
            *)operator_new(0x30);
  p_Var2 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_m_jointStatesMap = pmVar1;
  return;
}

Assistant:

MADPComponentFactoredStates::MADPComponentFactoredStates() 
    :
        _m_initialized(false)
        , _m_nrStates(0)
        , _m_nrStateFactors(0)
        , _m_stepSize(0)
        , _m_initialStateDistribution(0)
{
    _m_jointStatesMap=new map<vector<Index>, State*>;
}